

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void reset_dec_workers(AV1Decoder *pbi,AVxWorkerHook worker_hook,int num_workers)

{
  AVxWorkerInterface *pAVar1;
  AVxWorker *pAVar2;
  long *plVar3;
  int in_EDX;
  AVxWorkerHook in_RSI;
  void *in_RDI;
  int j;
  DecWorkerData *thread_data;
  AVxWorker *worker;
  int worker_idx;
  AVxWorkerInterface *winterface;
  int local_3c;
  int local_24;
  
  pAVar1 = aom_get_worker_interface();
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    pAVar2 = (AVxWorker *)(*(long *)((long)in_RDI + 0xa120) + (long)local_24 * 0x38);
    plVar3 = (long *)(*(long *)((long)in_RDI + 0xa130) + (long)local_24 * 0x1b0);
    memcpy((void *)*plVar3,in_RDI,0x3b60);
    *(undefined4 *)(*plVar3 + 0x3ad0) = 0;
    *(undefined8 *)(*plVar3 + 0x3ad8) = *(undefined8 *)(*plVar3 + 0x3eb68);
    *(undefined8 *)(*plVar3 + 0x3ae0) = *(undefined8 *)(*plVar3 + 0x3eb70);
    *(undefined8 *)(*plVar3 + 0x3ab8) = *(undefined8 *)(*plVar3 + 0x3eb88);
    if (local_24 != 0) {
      *(undefined8 *)(*plVar3 + 0x2a10) = *(undefined8 *)(*plVar3 + 0x3eb78);
    }
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      *(undefined8 *)(*plVar3 + 0x3ac0 + (long)local_3c * 8) =
           *(undefined8 *)(*plVar3 + 0x3eb90 + (long)local_3c * 8);
    }
    (*pAVar1->sync)(pAVar2);
    pAVar2->hook = in_RSI;
    pAVar2->data1 = plVar3;
    pAVar2->data2 = in_RDI;
  }
  return;
}

Assistant:

static inline void reset_dec_workers(AV1Decoder *pbi, AVxWorkerHook worker_hook,
                                     int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  // Reset tile decoding hook
  for (int worker_idx = 0; worker_idx < num_workers; ++worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx];
    DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
    thread_data->td->dcb = pbi->dcb;
    thread_data->td->dcb.corrupted = 0;
    thread_data->td->dcb.mc_buf[0] = thread_data->td->mc_buf[0];
    thread_data->td->dcb.mc_buf[1] = thread_data->td->mc_buf[1];
    thread_data->td->dcb.xd.tmp_conv_dst = thread_data->td->tmp_conv_dst;
    if (worker_idx)
      thread_data->td->dcb.xd.seg_mask = thread_data->td->seg_mask;
    for (int j = 0; j < 2; ++j) {
      thread_data->td->dcb.xd.tmp_obmc_bufs[j] =
          thread_data->td->tmp_obmc_bufs[j];
    }
    winterface->sync(worker);

    worker->hook = worker_hook;
    worker->data1 = thread_data;
    worker->data2 = pbi;
  }
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    aom_accounting_reset(&pbi->accounting);
  }
#endif
}